

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

void __thiscall
Jupiter::IRC::Client::Channel::delUserPrefix(Channel *this,string_view in_nickname,char prefix)

{
  bool bVar1;
  element_type *peVar2;
  size_type __pos;
  string_view in_nickname_00;
  size_t prefix_pos;
  undefined1 local_38 [8];
  shared_ptr<Jupiter::IRC::Client::Channel::User> user;
  char prefix_local;
  Channel *this_local;
  string_view in_nickname_local;
  
  in_nickname_00._M_str = (char *)in_nickname._M_len;
  in_nickname_00._M_len = (size_t)this;
  user.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = prefix;
  getUser((Channel *)local_38,in_nickname_00);
  bVar1 = std::operator==((shared_ptr<Jupiter::IRC::Client::Channel::User> *)local_38,(nullptr_t)0x0
                         );
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    peVar2 = std::
             __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&peVar2->m_prefixes,
                       user.
                       super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi._7_1_,0);
    if (__pos != 0xffffffffffffffff) {
      peVar2 = std::
               __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&peVar2->m_prefixes,__pos,1);
    }
  }
  std::shared_ptr<Jupiter::IRC::Client::Channel::User>::~shared_ptr
            ((shared_ptr<Jupiter::IRC::Client::Channel::User> *)local_38);
  return;
}

Assistant:

void Jupiter::IRC::Client::Channel::delUserPrefix(std::string_view in_nickname, char prefix) {
	auto user = getUser(in_nickname);

	if (user != nullptr) {
		size_t prefix_pos = user->m_prefixes.find(prefix);
		if (prefix_pos != std::string::npos) {
			user->m_prefixes.erase(prefix_pos, 1);
		}
	}
}